

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_info.c
# Opt level: O3

void info_print_revision(lyout *out,lys_revision *rev,uint8_t rev_size)

{
  undefined7 in_register_00000011;
  long lVar1;
  lys_revision *plVar2;
  
  ly_print(out,"%-*s",0xb,"Revisions: ");
  if ((int)CONCAT71(in_register_00000011,rev_size) != 0) {
    ly_print(out,"%s\n",rev);
    if (rev_size != '\x01') {
      plVar2 = rev + 1;
      lVar1 = (ulong)rev_size - 1;
      do {
        ly_print(out,"%*s%s\n",0xb,"",plVar2);
        plVar2 = plVar2 + 1;
        lVar1 = lVar1 + -1;
      } while (lVar1 != 0);
    }
    return;
  }
  ly_print(out,"\n");
  return;
}

Assistant:

static void
info_print_revision(struct lyout *out, const struct lys_revision *rev, uint8_t rev_size)
{
    int i;

    ly_print(out, "%-*s", INDENT_LEN, "Revisions: ");

    if (rev_size) {
        ly_print(out, "%s\n", rev[0].date);
        for (i = 1; i < rev_size; ++i) {
            ly_print(out, "%*s%s\n", INDENT_LEN, "", rev[i].date);
        }
    } else {
        ly_print(out, "\n");
    }
}